

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_254152::AlsaCapture::start(AlsaCapture *this)

{
  int iVar1;
  backend_exception *this_00;
  undefined8 uVar2;
  
  iVar1 = (*(anonymous_namespace)::psnd_pcm_prepare)(this->mPcmHandle);
  if (iVar1 < 0) {
    this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
    uVar2 = (*(anonymous_namespace)::psnd_strerror)(iVar1);
    al::backend_exception::backend_exception(this_00,0xa004,"snd_pcm_prepare failed: %s",uVar2);
  }
  else {
    iVar1 = (*(anonymous_namespace)::psnd_pcm_start)(this->mPcmHandle);
    if (-1 < iVar1) {
      this->mDoCapture = true;
      return;
    }
    this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
    uVar2 = (*(anonymous_namespace)::psnd_strerror)(iVar1);
    al::backend_exception::backend_exception(this_00,0xa004,"snd_pcm_start failed: %s",uVar2);
  }
  __cxa_throw(this_00,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void AlsaCapture::start()
{
    int err{snd_pcm_prepare(mPcmHandle)};
    if(err < 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "snd_pcm_prepare failed: %s",
            snd_strerror(err)};

    err = snd_pcm_start(mPcmHandle);
    if(err < 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "snd_pcm_start failed: %s",
            snd_strerror(err)};

    mDoCapture = true;
}